

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * rbuMalloc(sqlite3rbu *p,sqlite3_int64 nByte)

{
  void *pvVar1;
  
  if (p->rc == 0) {
    pvVar1 = sqlite3_malloc64(nByte);
    if (pvVar1 != (void *)0x0) {
      pvVar1 = memset(pvVar1,0,nByte);
      return pvVar1;
    }
    p->rc = 7;
  }
  return (void *)0x0;
}

Assistant:

static void *rbuMalloc(sqlite3rbu *p, sqlite3_int64 nByte){
  void *pRet = 0;
  if( p->rc==SQLITE_OK ){
    assert( nByte>0 );
    pRet = sqlite3_malloc64(nByte);
    if( pRet==0 ){
      p->rc = SQLITE_NOMEM;
    }else{
      memset(pRet, 0, nByte);
    }
  }
  return pRet;
}